

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_MeshInterface.cpp
# Opt level: O1

bool __thiscall
Opcode::MeshInterface::RemapClient(MeshInterface *this,udword nb_indices,udword *permutation)

{
  udword uVar1;
  uint uVar2;
  IndexedTriangle *pIVar3;
  bool bVar4;
  ulong *puVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  if (permutation != (udword *)0x0 && nb_indices != 0) {
    uVar6 = (ulong)this->mNbTris;
    if (this->mNbTris == nb_indices) {
      puVar5 = (ulong *)operator_new__(uVar6 * 0xc + 8);
      *puVar5 = uVar6;
      uVar1 = this->mTriStride;
      if (uVar6 != 0) {
        pIVar3 = this->mTris;
        uVar7 = 0;
        lVar8 = 0;
        do {
          *(undefined4 *)((long)puVar5 + lVar8 + 0x10) =
               *(undefined4 *)((long)pIVar3->mVRef + (ulong)uVar7 + 8);
          *(undefined8 *)((long)puVar5 + lVar8 + 8) =
               *(undefined8 *)((long)pIVar3->mVRef + (ulong)uVar7);
          lVar8 = lVar8 + 0xc;
          uVar7 = uVar7 + uVar1;
        } while (uVar6 * 0xc != lVar8);
      }
      if (this->mNbTris != 0) {
        uVar7 = 0;
        uVar6 = 0;
        do {
          pIVar3 = this->mTris;
          uVar2 = permutation[uVar6];
          *(undefined4 *)((long)pIVar3->mVRef + (ulong)uVar7 + 8) =
               *(undefined4 *)((long)puVar5 + (ulong)uVar2 * 0xc + 0x10);
          *(undefined8 *)((long)pIVar3->mVRef + (ulong)uVar7) =
               *(undefined8 *)((long)puVar5 + (ulong)uVar2 * 0xc + 8);
          uVar6 = uVar6 + 1;
          uVar7 = uVar7 + uVar1;
        } while (uVar6 < this->mNbTris);
      }
      operator_delete__(puVar5,*puVar5 * 0xc + 8);
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool MeshInterface::RemapClient(udword nb_indices, const udword* permutation) const
{
	// Checkings
	if(!nb_indices || !permutation)	return false;
	if(nb_indices!=mNbTris)			return false;

#ifdef OPC_USE_CALLBACKS
	// We can't really do that using callbacks
	return false;
#else
	IndexedTriangle* Tmp = new IndexedTriangle[mNbTris];
	CHECKALLOC(Tmp);

	#ifdef OPC_USE_STRIDE
	udword Stride = mTriStride;
	#else
	udword Stride = sizeof(IndexedTriangle);
	#endif

	for(udword i=0;i<mNbTris;i++)
	{
		const IndexedTriangle* T = (const IndexedTriangle*)(((ubyte*)mTris) + i * Stride);
		Tmp[i] = *T;
	}

	for(udword i=0;i<mNbTris;i++)
	{
		IndexedTriangle* T = (IndexedTriangle*)(((ubyte*)mTris) + i * Stride);
		*T = Tmp[permutation[i]];
	}

	DELETEARRAY(Tmp);
#endif
	return true;
}